

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_Vk.cpp
# Opt level: O2

void Diligent::SerializationDeviceImpl::GetPipelineResourceBindingsVk
               (PipelineResourceBindingAttribs *Info,
               vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
               *ResourceBindings)

{
  SHADER_TYPE SVar1;
  PipelineResourceDesc *ResDesc;
  PipelineResourceAttribsType *pPVar2;
  long lVar3;
  char (*Args_1) [51];
  Uint32 r;
  uint ResIndex;
  PipelineResourceSignatureVkImpl *this;
  uint uVar4;
  ulong uVar5;
  Uint32 SignaturesCount;
  string msg;
  uint local_b4;
  PipelineResourceBinding local_b0;
  PipelineResourceBindingAttribs *local_90;
  ulong local_88;
  vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
  *local_80;
  SignatureArray<Diligent::PipelineResourceSignatureVkImpl> local_78;
  
  SVar1 = Info->ShaderStages;
  uVar4 = 0;
  local_78._M_elems[6].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[7].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[4].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[5].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  Args_1 = (char (*) [51])&local_b4;
  local_b4 = 0;
  local_78._M_elems[2].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[3].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[0].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[1].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_90 = Info;
  local_80 = ResourceBindings;
  anon_unknown_60::SortResourceSignatures<Diligent::PipelineResourceSignatureVkImpl>
            (Info->ppResourceSignatures,Info->ResourceSignaturesCount,&local_78,(Uint32 *)Args_1);
  local_88 = (ulong)local_b4;
  for (uVar5 = 0; uVar5 != local_88; uVar5 = uVar5 + 1) {
    this = local_78._M_elems[uVar5].m_pObject;
    if (this != (PipelineResourceSignatureVkImpl *)0x0) {
      for (ResIndex = 0;
          ResIndex <
          (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
          .m_Desc.NumResources; ResIndex = ResIndex + 1) {
        ResDesc = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                            (&this->
                              super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                             ResIndex);
        pPVar2 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                           (&(local_78._M_elems[uVar5].m_pObject)->
                             super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                            ResIndex);
        if ((ResDesc->ShaderStages & (-(uint)(SVar1 == SHADER_TYPE_UNKNOWN) | SVar1)) !=
            SHADER_TYPE_UNKNOWN) {
          Args_1 = (char (*) [51])(*(ulong *)pPVar2 & 0xffff);
          ResDescToPipelineResBinding
                    (&local_b0,ResDesc,ResDesc->ShaderStages,(Uint32)Args_1,
                     uVar4 + ((*(ulong *)pPVar2 >> 0x3e & 1) != 0));
          std::
          vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
          ::emplace_back<Diligent::PipelineResourceBinding>(local_80,&local_b0);
        }
        this = local_78._M_elems[uVar5].m_pObject;
      }
      local_b0.Name = (Char *)0x0;
      local_b0.ResourceType = SHADER_RESOURCE_TYPE_CONSTANT_BUFFER;
      local_b0._9_3_ = 0;
      local_b0.ShaderStages = SHADER_TYPE_UNKNOWN;
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 8) {
        Args_1 = *(char (**) [51])((long)&local_b0.Name + lVar3);
        uVar4 = uVar4 + ((this->m_DescriptorSetSizes)._M_elems[(long)Args_1] != 0xffffffff);
      }
    }
  }
  if (0x10 < uVar4) {
    FormatString<char[26],char[50]>
              ((string *)&local_b0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2",
               (char (*) [50])Args_1);
    Args_1 = (char (*) [51])0x106;
    DebugAssertionFailed
              (local_b0.Name,"GetPipelineResourceBindingsVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0x106);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (uVar4 < local_90->ResourceSignaturesCount) {
    FormatString<char[26],char[51]>
              ((string *)&local_b0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescSetLayoutCount >= Info.ResourceSignaturesCount",Args_1);
    DebugAssertionFailed
              (local_b0.Name,"GetPipelineResourceBindingsVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0x107);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL>::~array
            (&local_78);
  return;
}

Assistant:

void SerializationDeviceImpl::GetPipelineResourceBindingsVk(const PipelineResourceBindingAttribs& Info,
                                                            std::vector<PipelineResourceBinding>& ResourceBindings)
{
    const auto ShaderStages = (Info.ShaderStages == SHADER_TYPE_UNKNOWN ? static_cast<SHADER_TYPE>(~0u) : Info.ShaderStages);

    SignatureArray<PipelineResourceSignatureVkImpl> Signatures      = {};
    Uint32                                          SignaturesCount = 0;
    SortResourceSignatures(Info.ppResourceSignatures, Info.ResourceSignaturesCount, Signatures, SignaturesCount);

    Uint32 DescSetLayoutCount = 0;
    for (Uint32 sign = 0; sign < SignaturesCount; ++sign)
    {
        const auto& pSignature = Signatures[sign];
        if (pSignature == nullptr)
            continue;

        for (Uint32 r = 0; r < pSignature->GetTotalResourceCount(); ++r)
        {
            const auto& ResDesc = pSignature->GetResourceDesc(r);
            const auto& ResAttr = pSignature->GetResourceAttribs(r);
            if ((ResDesc.ShaderStages & ShaderStages) == 0)
                continue;

            ResourceBindings.push_back(ResDescToPipelineResBinding(ResDesc, ResDesc.ShaderStages, ResAttr.BindingIndex, DescSetLayoutCount + ResAttr.DescrSet));
        }

        // Same as PipelineLayoutVk::Create()
        for (auto SetId : {PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE, PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC})
        {
            if (pSignature->GetDescriptorSetSize(SetId) != ~0u)
                ++DescSetLayoutCount;
        }
    }
    VERIFY_EXPR(DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2);
    VERIFY_EXPR(DescSetLayoutCount >= Info.ResourceSignaturesCount);
}